

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

void draw_player(int r,int g,int b,_func_int_float_ptr_int_ptr_int *project)

{
  int iVar1;
  code *in_RCX;
  int i;
  int ishape [12];
  float shape [12];
  int in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  int local_7c;
  undefined1 local_78 [48];
  float local_48 [3];
  undefined4 local_3c;
  float local_38;
  undefined4 local_34;
  float local_30;
  undefined4 local_2c;
  float local_28;
  undefined4 local_24;
  float local_20;
  undefined4 local_1c;
  code *local_18;
  
  local_18 = in_RCX;
  for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
    if (ganja[local_7c] != 0) {
      local_48[0] = (float)local_7c / 16.0;
      local_48[1] = 0.98;
      local_48[2] = (float)(local_7c + 1) / 16.0;
      local_3c = 0x3f7ae148;
      local_38 = (float)(local_7c + 1) / 16.0;
      local_34 = 0x3f800000;
      local_30 = (float)local_7c / 16.0;
      local_2c = 0x3f800000;
      iVar1 = (*local_18)(local_48,local_78,8);
      if (iVar1 != 0) {
        makecol((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50,
                in_stack_ffffffffffffff4c);
        polygon((int)shape[5],(int *)shape._8_8_,(ALLEGRO_COLOR)shape._24_16_);
      }
    }
  }
  if (((init_time & 4U) == 0) && (die_time == 0)) {
    local_48[0] = pos - 0.04;
    local_48[1] = 0.98;
    local_48[2] = pos - 0.02;
    local_3c = 0x3f7851ec;
    local_38 = pos;
    local_34 = 0x3f733333;
    local_30 = pos + 0.02;
    local_2c = 0x3f7851ec;
    local_28 = pos + 0.04;
    local_24 = 0x3f7ae148;
    local_20 = pos;
    local_1c = 0x3f7ae148;
    iVar1 = (*local_18)(local_48,local_78,0xc);
    if (iVar1 != 0) {
      makecol((int)((ulong)local_78 >> 0x20),(int)local_78,in_stack_ffffffffffffff4c);
      polygon((int)shape[5],(int *)shape._8_8_,(ALLEGRO_COLOR)shape._24_16_);
    }
  }
  return;
}

Assistant:

void draw_player(int r, int g, int b, int (*project)(float *f, int *i, int c))
{
   float shape[12];
   int ishape[12];
   int i;

   /* draw health segments */
   for (i=0; i<SEGMENTS; i++) {
      if (ganja[i]) {
	 shape[0] = (float)i / SEGMENTS;
	 shape[1] = 0.98;

	 shape[2] = (float)(i+1) / SEGMENTS;
	 shape[3] = 0.98;

	 shape[4] = (float)(i+1) / SEGMENTS;
	 shape[5] = 1.0;

	 shape[6] = (float)i / SEGMENTS;
	 shape[7] = 1.0;

	 if (project(shape, ishape, 8))
	    polygon(4, ishape, makecol(r/3, g/3, b/3));
      }
   }

   /* flash on and off while initing, don't show while dead */
   if ((init_time & 4) || (die_time))
      return;

   /* draw the ship */
   shape[0] = pos - 0.04;
   shape[1] = 0.98;

   shape[2] = pos - 0.02;
   shape[3] = 0.97;

   shape[4] = pos;
   shape[5] = 0.95;

   shape[6] = pos + 0.02;
   shape[7] = 0.97;

   shape[8] = pos + 0.04;
   shape[9] = 0.98;

   shape[10] = pos;
   shape[11] = 0.98;

   if (project(shape, ishape, 12))
      polygon(6, ishape, makecol(r, g, b));
}